

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportFileGenerator::PopulateLinkDependsInterface
          (cmExportFileGenerator *this,cmGeneratorTarget *gt,PreprocessContext preprocessRule,
          ImportPropertyMap *properties)

{
  cmValue cVar1;
  bool bVar2;
  ulong uVar3;
  string *input_00;
  mapped_type *this_00;
  allocator<char> local_101;
  key_type local_100;
  undefined4 local_e0;
  allocator<char> local_d9;
  string local_d8;
  undefined1 local_b8 [8];
  string prepro;
  key_type local_90;
  allocator<char> local_59;
  string local_58;
  cmValue local_38;
  cmValue input;
  char *propName;
  ImportPropertyMap *properties_local;
  PreprocessContext preprocessRule_local;
  cmGeneratorTarget *gt_local;
  cmExportFileGenerator *this_local;
  
  if (preprocessRule != InstallInterface) {
    __assert_fail("preprocessRule == cmGeneratorExpression::InstallInterface",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmExportFileGenerator.cxx"
                  ,0x1b4,
                  "void cmExportFileGenerator::PopulateLinkDependsInterface(const cmGeneratorTarget *, cmGeneratorExpression::PreprocessContext, ImportPropertyMap &)"
                 );
  }
  input.Value = (string *)anon_var_dwarf_9c8f1b;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"INTERFACE_LINK_DEPENDS",&local_59);
  local_38 = cmGeneratorTarget::GetProperty(gt,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  bVar2 = cmValue::operator_cast_to_bool(&local_38);
  if (!bVar2) {
    return;
  }
  cmValue::operator->[abi_cxx11_(&local_38);
  uVar3 = std::__cxx11::string::empty();
  cVar1 = input;
  if ((uVar3 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,(char *)cVar1.Value,
               (allocator<char> *)(prepro.field_2._M_local_buf + 0xf));
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[](properties,&local_90);
    std::__cxx11::string::clear();
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator((allocator<char> *)(prepro.field_2._M_local_buf + 0xf));
    return;
  }
  input_00 = cmValue::operator*[abi_cxx11_(&local_38);
  cmGeneratorExpression::Preprocess((string *)local_b8,input_00,InstallInterface,true);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    ResolveTargetsInGeneratorExpressions(this,(string *)local_b8,gt,NoReplaceFreeTargets);
    cVar1 = input;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,(char *)cVar1.Value,&local_d9);
    bVar2 = checkInterfaceDirs((string *)local_b8,gt,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator(&local_d9);
    cVar1 = input;
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      local_e0 = 1;
      goto LAB_004f6f0a;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,(char *)cVar1.Value,&local_101);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](properties,&local_100);
    std::__cxx11::string::operator=((string *)this_00,(string *)local_b8);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator(&local_101);
  }
  local_e0 = 0;
LAB_004f6f0a:
  std::__cxx11::string::~string((string *)local_b8);
  return;
}

Assistant:

void cmExportFileGenerator::PopulateLinkDependsInterface(
  cmGeneratorTarget const* gt,
  cmGeneratorExpression::PreprocessContext preprocessRule,
  ImportPropertyMap& properties)
{
  assert(preprocessRule == cmGeneratorExpression::InstallInterface);

  const char* propName = "INTERFACE_LINK_DEPENDS";
  cmValue input = gt->GetProperty(propName);

  if (!input) {
    return;
  }

  if (input->empty()) {
    properties[propName].clear();
    return;
  }

  std::string prepro =
    cmGeneratorExpression::Preprocess(*input, preprocessRule, true);
  if (!prepro.empty()) {
    this->ResolveTargetsInGeneratorExpressions(prepro, gt);

    if (!checkInterfaceDirs(prepro, gt, propName)) {
      return;
    }
    properties[propName] = prepro;
  }
}